

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateTag(HtmlparserCppTest *this,string *expected_tag)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  HtmlparserCppTest *pHVar6;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *pHVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  HtmlparserCppTest *pHVar9;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar10;
  HtmlParser *this_00;
  const_iterator cVar11;
  mapped_type *ppHVar12;
  undefined8 extraout_RAX_02;
  undefined7 uVar13;
  ulong uVar14;
  htmlparser_ctx *phVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  HtmlparserCppTest *pHVar18;
  _Base_ptr p_Var19;
  HtmlparserCppTest *pHVar20;
  htmlparser_ctx_s *phVar21;
  _Base_ptr p_Var22;
  pointer this_01;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_210;
  HtmlparserCppTest *pHStack_1f8;
  _Base_ptr p_Stack_1f0;
  undefined1 auStack_1b0 [16];
  _Base_ptr p_Stack_1a0;
  HtmlparserCppTest *pHStack_198;
  _Base_ptr p_Stack_190;
  undefined1 auStack_188 [16];
  _Base_ptr p_Stack_178;
  HtmlparserCppTest *pHStack_170;
  _Base_ptr p_Stack_168;
  char *pcStack_160;
  HtmlParser HStack_158;
  allocator aStack_119;
  HtmlparserCppTest *pHStack_118;
  size_t sStack_110;
  HtmlparserCppTest HStack_108;
  HtmlparserCppTest *pHStack_c8;
  ulong uStack_c0;
  HtmlparserCppTest *pHStack_b0;
  allocator aStack_99;
  HtmlparserCppTest *pHStack_98;
  size_t sStack_90;
  undefined1 auStack_88 [40];
  HtmlparserCppTest *pHStack_60;
  HtmlParser HStack_58;
  HtmlparserCppTest HStack_50;
  
  p_Var19 = (_Base_ptr)(this->parser_).parser_;
  HStack_50.parser_.parser_ = (htmlparser_ctx *)0x106fe5;
  pHVar6 = (HtmlparserCppTest *)expected_tag;
  lVar5 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)p_Var19);
  if (lVar5 == 0) {
    HStack_50.parser_.parser_ = (htmlparser_ctx *)0x10700f;
    ValidateTag();
  }
  else {
    HStack_50.parser_.parser_ = (htmlparser_ctx *)0x106ff3;
    pHVar6 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((this->parser_).parser_);
    HStack_50.parser_.parser_ = (htmlparser_ctx *)0x106ffe;
    p_Var19 = (_Base_ptr)expected_tag;
    iVar4 = std::__cxx11::string::compare((char *)expected_tag);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_50.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  pHVar9 = (HtmlparserCppTest *)
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&p_Var19[1]._M_left)->_M_allocated_capacity;
  HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107027;
  pHVar7 = pHVar6;
  HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)expected_tag;
  HStack_50.parser_.parser_ = (htmlparser_ctx *)this;
  lVar5 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)pHVar9);
  if (lVar5 == 0) {
    HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107051;
    ValidateAttribute();
  }
  else {
    HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107035;
    pHVar7 = (HtmlparserCppTest *)
             ctemplate_htmlparser::htmlparser_attr
                       ((htmlparser_ctx_s *)
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&p_Var19[1]._M_left)->_M_allocated_capacity);
    HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107040;
    pHVar9 = pHVar6;
    iVar4 = std::__cxx11::string::compare((char *)pHVar6);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar20 = (HtmlparserCppTest *)(pHVar9->parser_).parser_;
  auStack_88._24_8_ = (_Base_ptr)0x10706c;
  pHVar8 = pHVar7;
  HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar6;
  HStack_50.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var19;
  lVar5 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar20);
  if (lVar5 != 0) {
    auStack_88._24_8_ = (_Base_ptr)0x10707a;
    pHVar8 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_value((pHVar9->parser_).parser_);
    auStack_88._24_8_ = (_Base_ptr)0x10708f;
    pHVar20 = (HtmlparserCppTest *)&pHStack_60;
    std::__cxx11::string::string
              ((string *)&pHStack_60,(char *)pHVar8,(allocator *)(auStack_88 + 0x27));
    phVar15 = *(htmlparser_ctx **)&(pHVar7->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    pHVar9 = (HtmlparserCppTest *)&pHStack_60;
    if (phVar15 == HStack_58.parser_) {
      if (phVar15 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        if (pHStack_60 != &HStack_50) {
          auStack_88._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(pHStack_60);
        }
        return;
      }
      pHVar20 = *(HtmlparserCppTest **)&(pHVar7->contextMap)._M_t._M_impl;
      auStack_88._24_8_ = (_Base_ptr)0x1070ae;
      pHVar8 = pHStack_60;
      iVar4 = bcmp(pHVar20,pHStack_60,(size_t)phVar15);
      pHVar9 = pHStack_60;
      if (iVar4 == 0) goto LAB_001070b2;
    }
    auStack_88._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_88._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_88._24_8_ = pHVar9;
  auStack_88._16_8_ = pHVar7;
  pHVar6 = (HtmlparserCppTest *)(pHVar20->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar6);
  puVar16 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar6,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (*(long *)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar6 = (HtmlparserCppTest *)&pHStack_98;
    std::__cxx11::string::string((string *)pHVar6,(char *)pHVar7,&aStack_99);
    sVar2 = *(size_t *)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar16 = (undefined1 *)pHVar7;
    if (sVar2 == sStack_90) {
      uVar13 = (undefined7)((ulong)pHVar8 >> 8);
      if (sVar2 == 0) {
        pHVar8 = (HtmlparserCppTest *)CONCAT71(uVar13,1);
      }
      else {
        pHVar6 = *(HtmlparserCppTest **)&(pHVar8->contextMap)._M_t._M_impl;
        puVar16 = (undefined1 *)pHStack_98;
        iVar4 = bcmp(pHVar6,pHStack_98,sVar2);
        pHVar8 = (HtmlparserCppTest *)CONCAT71(uVar13,iVar4 == 0);
      }
    }
    else {
      pHVar8 = (HtmlparserCppTest *)0x0;
    }
    if (pHStack_98 != (HtmlparserCppTest *)auStack_88) {
      pHVar6 = pHStack_98;
      operator_delete(pHStack_98);
    }
    pHVar9 = pHStack_98;
    if ((char)pHVar8 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_c0 = 0x10717a;
  pHStack_b0 = pHVar8;
  bVar3 = StringToBool((string *)puVar16);
  uVar14 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar21 = (pHVar6->parser_).parser_;
  uStack_c0 = 0x107185;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar21);
  if (SUB81(uVar14,0) == (iVar4 != 0)) {
    return;
  }
  uStack_c0 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_c8 = pHVar6;
  uStack_c0 = uVar14;
  bVar3 = StringToBool((string *)puVar16);
  phVar15 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var19 = *(_Base_ptr *)(phVar21 + 0x30);
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var19);
  if (SUB81(phVar15,0) == (iVar4 != 0)) {
    return;
  }
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar21;
  HStack_108.parser_.parser_ = phVar15;
  bVar3 = StringToBool((string *)puVar16);
  p_Var22 = p_Var19[1]._M_left;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var22);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar6 = (HtmlparserCppTest *)p_Var22[1]._M_left;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var19;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar9;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar6);
  puVar17 = kJavascriptStateMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar6,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar6 = (HtmlparserCppTest *)&pHStack_118;
    std::__cxx11::string::string((string *)pHVar6,(char *)pHVar7,&aStack_119);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar17 = (undefined1 *)pHVar7;
    if (sVar2 == sStack_110) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        pHVar6 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
        puVar17 = (undefined1 *)pHStack_118;
        iVar4 = bcmp(pHVar6,pHStack_118,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_118 != &HStack_108) {
      pHVar6 = pHStack_118;
      operator_delete(pHStack_118);
    }
    pHVar9 = pHStack_118;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar17);
  pHVar7 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar7);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar8 = (HtmlparserCppTest *)&pcStack_160;
  pHVar20 = pHVar7;
  HStack_158.parser_ = (htmlparser_ctx *)pHVar6;
  if (*(long *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar8 = (HtmlparserCppTest *)puVar17;
    p_Stack_168 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_168 = (_Base_ptr)0x1072dc;
    pcStack_160 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar20 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl;
    p_Stack_168 = (_Base_ptr)0x1072f8;
    pHVar9 = (HtmlparserCppTest *)strtol((char *)pHVar20,&pcStack_160,10);
    pHVar6 = pHVar7;
    puVar17 = (undefined1 *)pHVar8;
    unaff_R12 = (_Base_ptr)&pcStack_160;
    if ((*pcStack_160 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_160, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar20 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
    p_Stack_168 = (_Base_ptr)0x107313;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar20);
    unaff_R12 = (_Base_ptr)&pcStack_160;
    if (iVar4 == (int)pHVar9) {
      return;
    }
  }
  p_Stack_168 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  pHVar18 = (HtmlparserCppTest *)auStack_188;
  pHVar7 = pHVar20;
  auStack_188._8_8_ = pHVar6;
  p_Stack_178 = unaff_R12;
  pHStack_170 = pHVar9;
  p_Stack_168 = unaff_R15;
  if (*(long *)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar18 = pHVar8;
    p_Stack_190 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_190 = (_Base_ptr)0x107348;
    auStack_188._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar7 = *(HtmlparserCppTest **)&(pHVar8->contextMap)._M_t._M_impl;
    p_Stack_190 = (_Base_ptr)0x107364;
    pHVar9 = (HtmlparserCppTest *)strtol((char *)pHVar7,(char **)auStack_188,10);
    pHVar6 = pHVar20;
    pHVar8 = pHVar18;
    unaff_R12 = (_Base_ptr)auStack_188;
    if ((*(char *)auStack_188._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_188, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar7 = (HtmlparserCppTest *)(pHVar20->parser_).parser_;
    p_Stack_190 = (_Base_ptr)0x10737f;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar7);
    unaff_R12 = (_Base_ptr)auStack_188;
    if (iVar4 == (int)pHVar9) {
      return;
    }
  }
  p_Stack_190 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  pHVar8 = (HtmlparserCppTest *)auStack_1b0;
  pHVar20 = pHVar7;
  auStack_1b0._8_8_ = pHVar6;
  p_Stack_1a0 = unaff_R12;
  pHStack_198 = pHVar9;
  p_Stack_190 = unaff_R15;
  if (*(long *)&(pHVar18->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    auStack_1b0._0_8_ = extraout_RAX_01;
    piVar10 = __errno_location();
    *piVar10 = 0;
    pHVar20 = *(HtmlparserCppTest **)&(pHVar18->contextMap)._M_t._M_impl;
    lVar5 = strtol((char *)pHVar20,(char **)auStack_1b0,10);
    pHVar18 = pHVar8;
    unaff_R12 = (_Base_ptr)auStack_1b0;
    if ((*(char *)auStack_1b0._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_1b0, *piVar10 == 0))
    {
      pHVar20 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
      iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar20);
      unaff_R12 = (_Base_ptr)auStack_1b0;
      if (iVar4 == (int)lVar5) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar8 = pHVar18;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar3 = StringToBool((string *)pHVar8);
  pHVar6 = (HtmlparserCppTest *)(pHVar20->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar6);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_1f8 = pHVar20;
  p_Stack_1f0 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar8,"=",",",&vStack_210);
  if (vStack_210.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_210.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar6->parser_;
    p_Var1 = &(pHVar6->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_210.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar6,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar6,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar6,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar6,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar6,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar6,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar6,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar6,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar6,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar6,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar6,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar6,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar6,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar6,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar11 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar6,str);
                                    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar6->contextMap,str);
                                      *ppHVar12 = this_00;
                                    }
                                    ppHVar12 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar6->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar12,source);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar11 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar6,str);
                                      if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_210);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar6->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar12);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_00107851;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_210.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_210);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateTag(const string &expected_tag) {
  EXPECT_TRUE(parser_.tag() != NULL);
  EXPECT_TRUE(expected_tag == parser_.tag())
      << "Unexpected attr tag name at line " << parser_.line_number();
}